

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O2

int Hsh_IntManHash(uint *pData,int nSize,int nTableSize)

{
  ulong uVar1;
  uint uVar2;
  
  uVar2 = 0;
  for (uVar1 = 0; (uint)(nSize << 2) != uVar1; uVar1 = uVar1 + 1) {
    uVar2 = (uVar2 + *(byte *)((long)pData + uVar1)) * 0x401;
    uVar2 = uVar2 >> 6 ^ uVar2;
  }
  return ((uVar2 * 9 >> 0xb ^ uVar2 * 9) * 0x8001) % (uint)nTableSize;
}

Assistant:

static inline int Hsh_IntManHash( unsigned * pData, int nSize, int nTableSize ) 
{
    int i = 0; unsigned hash = 0;
    unsigned char * pDataC = (unsigned char *)pData;
    nSize <<= 2;
    while ( i != nSize ) 
    {
        hash += pDataC[i++];
        hash += hash << 10;
        hash ^= hash >> 6;
    }
    hash += hash << 3;
    hash ^= hash >> 11;
    hash += hash << 15;
    return (int)(hash % nTableSize);
}